

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

void N_VPrintFile(N_Vector v,FILE *outfile)

{
  FILE *in_RSI;
  long in_RDI;
  
  if (in_RSI != (FILE *)0x0) {
    if (in_RDI == 0) {
      fprintf(in_RSI,"NULL Vector\n");
    }
    else if (*(long *)(*(long *)(in_RDI + 8) + 0x1b0) == 0) {
      fprintf(in_RSI,"NULL PrintFile Op\n");
    }
    else {
      (**(code **)(*(long *)(in_RDI + 8) + 0x1b0))(in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void N_VPrintFile(N_Vector v, FILE* outfile)
{
  if (outfile != NULL) {
    if (v == NULL) {
      fprintf(outfile, "NULL Vector\n");
    } else if (v->ops->nvprintfile == NULL) {
      fprintf(outfile, "NULL PrintFile Op\n");
    } else {
      v->ops->nvprintfile(v, outfile);
    }
  }
}